

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# L2NormCost.cpp
# Opt level: O3

void __thiscall
iDynTree::optimalcontrol::IndexSelector::IndexSelector
          (IndexSelector *this,IndexRange *selectedRange,uint totalSize)

{
  ulong uVar1;
  ptrdiff_t pVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  long lVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar12 [16];
  undefined8 uVar13;
  long lVar11;
  
  Selector::Selector(&this->super_Selector,(uint)selectedRange->size);
  (this->super_Selector)._vptr_Selector = (_func_int **)&PTR__IndexSelector_0019a038;
  pVar2 = selectedRange->size;
  (this->m_selectedIndex).offset = selectedRange->offset;
  (this->m_selectedIndex).size = pVar2;
  iDynTree::MatrixDynSize::resize
            ((ulong)&(this->super_Selector).m_selectionMatrix,(ulong)(uint)selectedRange->size);
  lVar5 = iDynTree::MatrixDynSize::data();
  iDynTree::MatrixDynSize::rows();
  lVar6 = iDynTree::MatrixDynSize::cols();
  auVar4 = _DAT_001809f0;
  auVar3 = _DAT_001809e0;
  uVar1 = selectedRange->size;
  if (0 < (long)uVar1) {
    lVar11 = uVar1 - 1;
    auVar9._8_4_ = (int)lVar11;
    auVar9._0_8_ = lVar11;
    auVar9._12_4_ = (int)((ulong)lVar11 >> 0x20);
    lVar5 = lVar5 + selectedRange->offset * 8 + 8;
    uVar7 = 0;
    auVar9 = auVar9 ^ _DAT_001809f0;
    do {
      uVar8 = 0;
      auVar10 = auVar3;
      do {
        auVar12 = auVar10 ^ auVar4;
        if ((bool)(~(auVar12._4_4_ == auVar9._4_4_ && auVar9._0_4_ < auVar12._0_4_ ||
                    auVar9._4_4_ < auVar12._4_4_) & 1)) {
          uVar13 = 0x3ff0000000000000;
          if (uVar7 != uVar8) {
            uVar13 = 0;
          }
          *(undefined8 *)(lVar5 + -8 + uVar8 * 8) = uVar13;
        }
        if ((auVar12._12_4_ != auVar9._12_4_ || auVar12._8_4_ <= auVar9._8_4_) &&
            auVar12._12_4_ <= auVar9._12_4_) {
          uVar13 = 0x3ff0000000000000;
          if (uVar7 - 1 != uVar8) {
            uVar13 = 0;
          }
          *(undefined8 *)(lVar5 + uVar8 * 8) = uVar13;
        }
        uVar8 = uVar8 + 2;
        lVar11 = auVar10._8_8_;
        auVar10._0_8_ = auVar10._0_8_ + 2;
        auVar10._8_8_ = lVar11 + 2;
      } while ((uVar1 + 1 & 0xfffffffffffffffe) != uVar8);
      uVar7 = uVar7 + 1;
      lVar5 = lVar5 + lVar6 * 8;
    } while (uVar7 != uVar1);
  }
  SparsityStructure::addDenseBlock
            (&(this->super_Selector).m_correspondingHessianSparsity,selectedRange,selectedRange);
  return;
}

Assistant:

IndexSelector(const IndexRange& selectedRange, unsigned int totalSize)
                : Selector(static_cast<unsigned int>(selectedRange.size))
                , m_selectedIndex(selectedRange)
            {
                m_selectionMatrix.resize(static_cast<unsigned int>(selectedRange.size), totalSize);
                toEigen(m_selectionMatrix).block(0, selectedRange.offset, selectedRange.size, selectedRange.size).setIdentity();
                m_correspondingHessianSparsity.addDenseBlock(selectedRange, selectedRange);
            }